

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O2

int readwbmp(_func_int_void_ptr *getin,void *in,Wbmp **return_wbmp)

{
  int iVar1;
  uint uVar2;
  Wbmp *ptr;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  ptr = (Wbmp *)gdMalloc(0x18);
  if (ptr != (Wbmp *)0x0) {
    iVar1 = (*getin)(in);
    ptr->type = iVar1;
    if ((iVar1 == 0) && (iVar1 = skipheader(getin,in), iVar1 == 0)) {
      iVar1 = getmbi(getin,in);
      ptr->width = iVar1;
      if (iVar1 != -1) {
        iVar1 = getmbi(getin,in);
        ptr->height = iVar1;
        if (((iVar1 != -1) && (iVar1 = overflow2(4,ptr->width), iVar1 == 0)) &&
           (iVar1 = overflow2(ptr->width << 2,ptr->height), iVar1 == 0)) {
          piVar3 = (int *)gdMalloc((long)ptr->height * (long)ptr->width * 4);
          ptr->bitmap = piVar3;
          if (piVar3 != (int *)0x0) {
            iVar6 = 0;
            for (iVar1 = 0; iVar1 < ptr->height; iVar1 = iVar1 + 1) {
              for (iVar7 = 0; iVar7 < ptr->width; iVar7 = iVar7 + 8) {
                uVar2 = (*getin)(in);
                iVar4 = iVar7;
                for (uVar5 = 7; uVar5 != 0xffffffff; uVar5 = uVar5 - 1) {
                  if (iVar4 < ptr->width) {
                    ptr->bitmap[iVar6] = (uint)((uVar2 >> (uVar5 & 0x1f) & 1) != 0);
                    iVar6 = iVar6 + 1;
                  }
                  iVar4 = iVar4 + 1;
                }
              }
            }
            *return_wbmp = ptr;
            return 0;
          }
        }
      }
    }
    gdFree(ptr);
  }
  return -1;
}

Assistant:

int readwbmp(int (*getin) (void *in), void *in, Wbmp **return_wbmp)
{
	int row, col, byte, pel, pos;
	Wbmp *wbmp;

	if((wbmp = (Wbmp *)gdMalloc(sizeof(Wbmp))) == NULL) {
		return -1;
	}

	wbmp->type = getin(in);
	if(wbmp->type != 0) {
		gdFree(wbmp);
		return -1;
	}

	if(skipheader(getin, in)) {
		gdFree(wbmp);
		return -1;
	}

	wbmp->width = getmbi(getin, in);
	if(wbmp->width == -1) {
		gdFree(wbmp);
		return -1;
	}

	wbmp->height = getmbi(getin, in);
	if(wbmp->height == -1) {
		gdFree(wbmp);
		return -1;
	}

#ifdef __DEBUG
	printf("W: %d, H: %d\n", wbmp->width, wbmp->height);
#endif

	if(	overflow2(sizeof(int), wbmp->width) ||
		overflow2(sizeof(int) * wbmp->width, wbmp->height)) {
		gdFree(wbmp);
		return -1;
	}

	if((wbmp->bitmap = (int *)gdMalloc(sizeof(int) * wbmp->width * wbmp->height)) == NULL) {
		gdFree(wbmp);
		return -1;
	}

#ifdef __DEBUG
	printf("DATA CONSTRUCTED\n");
#endif

	pos = 0;
	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width;) {
			byte = getin(in);

			for(pel = 7; pel >= 0; pel--) {
				if(col++ < wbmp->width) {
					if(byte & 1 << pel) {
						wbmp->bitmap[pos] = WBMP_WHITE;
					} else {
						wbmp->bitmap[pos] = WBMP_BLACK;
					}
					pos++;
				}
			}
		}
	}

	*return_wbmp = wbmp;

	return 0;
}